

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

void Tas_ManDeriveReason(Tas_Man_t *p,int Level)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  void **ppvVar8;
  Gia_Obj_t **ppGVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  
  lVar16 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar16] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2f9,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  uVar17 = lVar16 + 1;
  iVar15 = (int)uVar17;
  if ((p->pClauses).iTail <= iVar15) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2fa,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  if (iVar15 < (p->pClauses).iTail) {
    uVar14 = uVar17 & 0xffffffff;
    do {
      pGVar3 = (p->pClauses).pData[uVar17];
      if (-1 < *(long *)pGVar3) {
        *(long *)pGVar3 = *(long *)pGVar3 + -0x8000000000000000;
        pVVar10 = p->vTemp;
        uVar13 = pVVar10->nCap;
        if (pVVar10->nSize == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
            }
            pVVar10->pArray = ppvVar8;
            iVar15 = 0x10;
          }
          else {
            iVar15 = uVar13 * 2;
            if (iVar15 <= (int)uVar13) goto LAB_00699186;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar13 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar13 << 4);
            }
            pVVar10->pArray = ppvVar8;
          }
          pVVar10->nCap = iVar15;
        }
LAB_00699186:
        iVar15 = pVVar10->nSize;
        pVVar10->nSize = iVar15 + 1;
        pVVar10->pArray[iVar15] = pGVar3;
        uVar13 = pGVar3->Value;
        if (uVar13 == 0xffffffff) {
LAB_00699572:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x83,"int Tas_VarDecLevel(Tas_Man_t *, Gia_Obj_t *)");
        }
        uVar6 = uVar13 * 3;
        if ((int)uVar6 < 0) goto LAB_00699553;
        uVar1 = p->vLevReas->nSize;
        if (uVar1 == uVar6 || SBORROW4(uVar1,uVar6) != (int)(uVar1 + uVar13 * -3) < 0)
        goto LAB_00699553;
        piVar4 = p->vLevReas->pArray;
        if (piVar4[uVar6] < Level) {
          ppGVar9 = (p->pClauses).pData;
          lVar16 = (long)(int)uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        else {
          if (piVar4[uVar6] != Level) {
            __assert_fail("iLitLevel == Level",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x318,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
          }
          uVar13 = uVar6 + 1;
          if (((int)uVar13 < 0) || ((int)uVar1 <= (int)uVar13)) goto LAB_00699553;
          iVar15 = piVar4[uVar13];
          if ((long)iVar15 == 0) {
            uVar13 = uVar6 + 2;
            if (((int)uVar13 < 0) || ((int)uVar1 <= (int)uVar13)) goto LAB_00699553;
            if (piVar4[uVar13] != 0) {
              uVar6 = uVar6 + 2;
              if (((int)uVar6 < 0) || ((int)uVar1 <= (int)uVar6)) goto LAB_00699553;
              lVar16 = (long)piVar4[uVar6];
              piVar4 = (p->pStore).pData;
              if (piVar4[lVar16 + 3] < 0) {
LAB_00699591:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              uVar13 = (uint)piVar4[lVar16 + 3] >> 1;
              if (p->pAig->nObjs <= (int)uVar13) {
LAB_006995b0:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p->pAig->pObjs + uVar13 != pGVar3) {
                __assert_fail("pReason == pObj",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                              ,0x31d,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
              }
              if (1 < piVar4[lVar16 + 2]) {
                lVar11 = 4;
                do {
                  uVar13 = piVar4[lVar16 + lVar11];
                  if ((int)uVar13 < 0) goto LAB_00699591;
                  uVar6 = uVar13 >> 1;
                  if (p->pAig->nObjs <= (int)uVar6) goto LAB_006995b0;
                  pGVar3 = p->pAig->pObjs;
                  uVar1 = pGVar3[uVar6].Value;
                  if (uVar1 == 0xffffffff) goto LAB_00699572;
                  iVar15 = uVar1 * 3;
                  if ((iVar15 < 0) ||
                     (iVar2 = p->vLevReas->nSize,
                     iVar2 == iVar15 || SBORROW4(iVar2,iVar15) != (int)(iVar2 + uVar1 * -3) < 0))
                  goto LAB_00699553;
                  pGVar3 = pGVar3 + uVar6;
                  uVar5 = *(undefined8 *)pGVar3;
                  if (((uint)uVar5 >> 0x1e & 1) == 0) {
                    __assert_fail("Tas_VarIsAssigned( pReason )",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                                  ,0x322,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
                  }
                  if ((((uint)((ulong)uVar5 >> 0x3e) ^ uVar13) & 1) != 0) {
                    __assert_fail("!Tas_LitIsTrue( pReason, pCls->pLits[j] )",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                                  ,0x323,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
                  }
                  iVar15 = (p->pClauses).nSize;
                  if ((p->pClauses).iTail == iVar15) {
                    (p->pClauses).nSize = iVar15 * 2;
                    ppGVar9 = (p->pClauses).pData;
                    if (ppGVar9 == (Gia_Obj_t **)0x0) {
                      ppGVar9 = (Gia_Obj_t **)malloc((long)iVar15 << 4);
                    }
                    else {
                      ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar15 << 4);
                    }
                    (p->pClauses).pData = ppGVar9;
                  }
                  iVar15 = (p->pClauses).iTail;
                  (p->pClauses).iTail = iVar15 + 1;
                  (p->pClauses).pData[iVar15] = pGVar3;
                  lVar12 = lVar11 + -2;
                  lVar11 = lVar11 + 1;
                } while (lVar12 < piVar4[lVar16 + 2]);
              }
              goto LAB_006991e2;
            }
          }
          if (iVar15 != 0) {
            iVar2 = (p->pClauses).nSize;
            if ((p->pClauses).iTail == iVar2) {
              (p->pClauses).nSize = iVar2 * 2;
              ppGVar9 = (p->pClauses).pData;
              if (ppGVar9 == (Gia_Obj_t **)0x0) {
                ppGVar9 = (Gia_Obj_t **)malloc((long)iVar2 << 4);
              }
              else {
                ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar2 << 4);
              }
              (p->pClauses).pData = ppGVar9;
            }
            iVar2 = (p->pClauses).iTail;
            iVar7 = iVar2 + 1;
            (p->pClauses).iTail = iVar7;
            (p->pClauses).pData[iVar2] = pGVar3 + iVar15;
            if (pGVar3->Value == 0xffffffff) {
              __assert_fail("pVar->Value != ~0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x85,"Gia_Obj_t *Tas_VarReason1(Tas_Man_t *, Gia_Obj_t *)");
            }
            uVar13 = pGVar3->Value * 3 + 2;
            if (((int)uVar13 < 0) || (p->vLevReas->nSize <= (int)uVar13)) {
LAB_00699553:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar16 = (long)p->vLevReas->pArray[uVar13];
            if (lVar16 != 0) {
              iVar15 = (p->pClauses).nSize;
              if (iVar7 == iVar15) {
                (p->pClauses).nSize = iVar15 * 2;
                ppGVar9 = (p->pClauses).pData;
                if (ppGVar9 == (Gia_Obj_t **)0x0) {
                  ppGVar9 = (Gia_Obj_t **)malloc((long)iVar15 << 4);
                }
                else {
                  ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar15 << 4);
                }
                (p->pClauses).pData = ppGVar9;
              }
              iVar15 = (p->pClauses).iTail;
              (p->pClauses).iTail = iVar15 + 1;
              (p->pClauses).pData[iVar15] = pGVar3 + lVar16;
            }
            goto LAB_006991e2;
          }
          ppGVar9 = (p->pClauses).pData;
          lVar16 = (long)(p->pClauses).iHead;
          if ((Level != 0) && (ppGVar9[lVar16] != (Gia_Obj_t *)0x0)) {
            __assert_fail("pQue->pData[pQue->iHead] == NULL || Level == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x32c,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
          }
          if (ppGVar9[lVar16] != (Gia_Obj_t *)0x0) {
            iVar15 = (p->pClauses).nSize;
            if ((p->pClauses).iTail == iVar15) {
              (p->pClauses).nSize = iVar15 * 2;
              ppGVar9 = (p->pClauses).pData;
              if (ppGVar9 == (Gia_Obj_t **)0x0) {
                ppGVar9 = (Gia_Obj_t **)malloc((long)iVar15 << 4);
              }
              else {
                ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar15 << 4);
              }
              (p->pClauses).pData = ppGVar9;
            }
            ppGVar9 = (p->pClauses).pData;
            iVar15 = (p->pClauses).iTail;
            lVar16 = (long)iVar15;
            (p->pClauses).iTail = iVar15 + 1;
          }
        }
        ppGVar9[lVar16] = pGVar3;
      }
LAB_006991e2:
      iVar15 = (int)uVar14;
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)(p->pClauses).iTail);
  }
  if ((p->pClauses).pData[(p->pClauses).iHead] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x339,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  (p->pClauses).iTail = iVar15;
  pVVar10 = p->vTemp;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      *(ulong *)pVVar10->pArray[lVar16] = *pVVar10->pArray[lVar16] & 0x7fffffffffffffff;
      lVar16 = lVar16 + 1;
      pVVar10 = p->vTemp;
    } while (lVar16 < pVVar10->nSize);
  }
  return;
}

Assistant:

static inline void Tas_ManDeriveReason( Tas_Man_t * p, int Level )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, j, iLitLevel, iLitLevel2;//, Id;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fPhase == 0 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Vec_PtrPush( p->vTemp, pObj );
        // bump activity
//        Id = Gia_ObjId( p->pAig, pObj );
//        if ( p->pActivity[Id] == 0.0 )
//            Vec_IntPush( p->vActiveVars, Id );
//        p->pActivity[Id] += p->Pars.VarInc;
        // check decision level
        iLitLevel = Tas_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        if ( Tas_VarHasReasonCls( p, pObj ) )
        {
            Tas_Cls_t * pCls = Tas_VarReasonCls( p, pObj );
            pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[0]) );
            assert( pReason == pObj );
            for ( j = 1; j < pCls->nLits; j++ )
            {
                pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[j]) );
                iLitLevel2 = Tas_VarDecLevel( p, pReason );
                assert( Tas_VarIsAssigned( pReason ) );
                assert( !Tas_LitIsTrue( pReason, pCls->pLits[j] ) );
                Tas_QuePush( pQue, pReason );
            }
        }
        else
        {
            pReason = Tas_VarReason0( p, pObj );
            if ( pReason == pObj ) // no reason
            {
                assert( pQue->pData[pQue->iHead] == NULL || Level == 0 );
                if ( pQue->pData[pQue->iHead] == NULL )
                    pQue->pData[pQue->iHead] = pObj;
                else
                    Tas_QuePush( pQue, pObj );
                continue;
            }
            Tas_QuePush( pQue, pReason );
            pReason = Tas_VarReason1( p, pObj );
            if ( pReason != pObj ) // second reason
                Tas_QuePush( pQue, pReason );
        }
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    if ( pQue->pData[pQue->iHead] == NULL )
        printf( "Tas_ManDeriveReason(): Failed to derive the clause!!!\n" );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fPhase = 0;
}